

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

void __thiscall
olc::PixelGameEngine::DrawWarpedDecal(PixelGameEngine *this,Decal *decal,vf2d *pos,Pixel *tint)

{
  undefined1 auVar1 [16];
  v2d_generic<float> vVar2;
  undefined1 auVar3 [16];
  int i;
  undefined4 extraout_EAX;
  int iVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float d [4];
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_80 [32];
  pointer pvStack_60;
  pointer local_58;
  pointer pvStack_50;
  pointer local_48;
  pointer pfStack_40;
  pointer local_38;
  pointer pPStack_30;
  pointer local_28;
  pointer pPStack_20;
  DecalMode local_18;
  uint32_t uStack_14;
  
  local_28 = (pointer)0x0;
  pPStack_20 = (pointer)0x0;
  local_38 = (pointer)0x0;
  pPStack_30 = (pointer)0x0;
  local_48 = (pointer)0x0;
  pfStack_40 = (pointer)0x0;
  local_58 = (pointer)0x0;
  pvStack_50 = (pointer)0x0;
  local_80._24_8_ = (pointer)0x0;
  pvStack_60 = (pointer)0x0;
  local_80._8_8_ = (pointer)0x0;
  local_80._16_8_ = (pointer)0x0;
  local_18 = NORMAL;
  uStack_14 = 4;
  local_a8._4_4_ = (tint->field_0).n;
  local_a8._0_4_ = local_a8._4_4_;
  local_a8._8_4_ = local_a8._4_4_;
  local_a8._12_4_ = local_a8._4_4_;
  local_80._0_8_ = decal;
  std::vector<olc::Pixel,std::allocator<olc::Pixel>>::_M_assign_aux<olc::Pixel_const*>
            ((vector<olc::Pixel,std::allocator<olc::Pixel>> *)&pPStack_30,local_a8);
  local_a8._0_8_ = 0x3f8000003f800000;
  local_a8._8_8_ = 0x3f8000003f800000;
  std::vector<float,std::allocator<float>>::_M_assign_aux<float_const*>
            ((vector<float,std::allocator<float>> *)&local_48,local_a8);
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
             (local_80 + 8),4);
  local_a8 = ZEXT816(0x3f80000000000000) << 0x40;
  local_98 = 0x3f8000003f800000;
  uStack_90 = 0x3f800000;
  std::vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>>::
  _M_assign_aux<olc::v2d_generic<float>const*>
            ((vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>> *)&pvStack_60,
             local_a8);
  fVar7 = pos->x;
  fVar8 = pos->y;
  fVar10 = pos[3].x - pos[1].x;
  fVar11 = pos[2].x - fVar7;
  fVar12 = pos[3].y - pos[1].y;
  fVar13 = pos[2].y - fVar8;
  fVar14 = fVar11 * fVar12 - fVar13 * fVar10;
  fVar9 = 0.0;
  if ((fVar14 != 0.0) || (NAN(fVar14))) {
    fVar15 = fVar8 - pos[1].y;
    fVar16 = fVar7 - pos[1].x;
    fVar10 = (1.0 / fVar14) * (fVar10 * fVar15 - fVar16 * fVar12);
    fVar12 = (1.0 / fVar14) * (fVar11 * fVar15 - fVar16 * fVar13);
    auVar3._4_4_ = -(uint)(1.0 < fVar12);
    auVar3._0_4_ = -(uint)(1.0 < fVar10);
    auVar3._8_4_ = -(uint)(fVar10 < 0.0);
    auVar3._12_4_ = -(uint)(fVar12 < 0.0);
    iVar4 = movmskps(extraout_EAX,auVar3);
    if (iVar4 == 0) {
      fVar8 = fVar8 + fVar13 * fVar10;
      fVar9 = fVar7 + fVar11 * fVar10;
    }
    else {
      fVar8 = 0.0;
    }
    auVar6._4_4_ = fVar8;
    auVar6._0_4_ = fVar8;
    auVar6._8_4_ = fVar8;
    auVar6._12_4_ = fVar8;
    fVar12 = pos->x - fVar9;
    fVar13 = pos[1].x - fVar9;
    fVar14 = pos[2].x - fVar9;
    fVar9 = pos[3].x - fVar9;
    fVar7 = pos->y - fVar8;
    fVar10 = pos[1].y - fVar8;
    fVar11 = pos[2].y - fVar8;
    fVar8 = pos[3].y - fVar8;
    auVar1._4_4_ = fVar13 * fVar13 + fVar10 * fVar10;
    auVar1._0_4_ = fVar12 * fVar12 + fVar7 * fVar7;
    auVar1._8_4_ = fVar14 * fVar14 + fVar11 * fVar11;
    auVar1._12_4_ = fVar9 * fVar9 + fVar8 * fVar8;
    local_a8 = sqrtps(auVar6,auVar1);
    uVar5 = 0;
    do {
      fVar7 = *(float *)(local_a8 + uVar5 * 4);
      if ((fVar7 != 0.0) || (fVar8 = 1.0, NAN(fVar7))) {
        fVar8 = (fVar7 + *(float *)(local_a8 + (uVar5 ^ 2) * 4)) /
                *(float *)(local_a8 + (uVar5 ^ 2) * 4);
      }
      vVar2.y = fVar8 * pvStack_60[uVar5].y;
      vVar2.x = fVar8 * pvStack_60[uVar5].x;
      pvStack_60[uVar5] = vVar2;
      local_48[uVar5] = fVar8 * local_48[uVar5];
      fVar7 = pos[uVar5].x * (this->vInvScreenSize).x;
      fVar8 = pos[uVar5].y * (this->vInvScreenSize).y;
      ((pointer)(local_80._8_8_ + uVar5 * 8))->x = fVar7 + fVar7 + -1.0;
      ((pointer)(local_80._8_8_ + uVar5 * 8))->y = -(fVar8 + fVar8 + -1.0);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 4);
    local_18 = this->nDecalMode;
    std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
              (&(this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
                _M_impl.super__Vector_impl_data._M_start[this->nTargetLayer].vecDecalInstance,
               (value_type *)local_80);
  }
  if (pPStack_30 != (pointer)0x0) {
    operator_delete(pPStack_30,(long)pPStack_20 - (long)pPStack_30);
  }
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  if (pvStack_60 != (pointer)0x0) {
    operator_delete(pvStack_60,(long)pvStack_50 - (long)pvStack_60);
  }
  if ((pointer)local_80._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_80._8_8_,local_80._24_8_ - local_80._8_8_);
  }
  return;
}

Assistant:

void PixelGameEngine::DrawWarpedDecal(olc::Decal *decal, const olc::vf2d *pos, const olc::Pixel &tint)
	{
		// Thanks Nathan Reed, a brilliant article explaining whats going on here
		// http://www.reedbeta.com/blog/quadrilateral-interpolation-part-1/
		DecalInstance di;
		di.points = 4;
		di.decal = decal;
		di.tint = {tint, tint, tint, tint};
		di.w = {1, 1, 1, 1};
		di.pos.resize(4);
		di.uv = {{0.0f, 0.0f}, {0.0f, 1.0f}, {1.0f, 1.0f}, {1.0f, 0.0f}};
		olc::vf2d center;
		float rd = ((pos[2].x - pos[0].x) * (pos[3].y - pos[1].y) - (pos[3].x - pos[1].x) * (pos[2].y - pos[0].y));
		if (rd != 0)
		{
			rd = 1.0f / rd;
			float rn = ((pos[3].x - pos[1].x) * (pos[0].y - pos[1].y) - (pos[3].y - pos[1].y) * (pos[0].x - pos[1].x)) * rd;
			float sn = ((pos[2].x - pos[0].x) * (pos[0].y - pos[1].y) - (pos[2].y - pos[0].y) * (pos[0].x - pos[1].x)) * rd;
			if (!(rn < 0.f || rn > 1.f || sn < 0.f || sn > 1.f))
				center = pos[0] + rn * (pos[2] - pos[0]);
			float d[4];
			for (int i = 0; i < 4; i++)
				d[i] = (pos[i] - center).mag();
			for (int i = 0; i < 4; i++)
			{
				float q = d[i] == 0.0f ? 1.0f : (d[i] + d[(i + 2) & 3]) / d[(i + 2) & 3];
				di.uv[i] *= q;
				di.w[i] *= q;
				di.pos[i] = {(pos[i].x * vInvScreenSize.x) * 2.0f - 1.0f, ((pos[i].y * vInvScreenSize.y) * 2.0f - 1.0f) * -1.0f};
			}
			di.mode = nDecalMode;
			vLayers[nTargetLayer].vecDecalInstance.push_back(di);
		}
	}